

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

handle pybind11::detail::
       type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
       ::cast(StringType *src,return_value_policy param_2,handle param_3)

{
  bool bVar1;
  char *buffer_00;
  ssize_t nbytes_00;
  error_already_set *this;
  ssize_t nbytes;
  char *buffer;
  return_value_policy param_1_local;
  StringType *src_local;
  handle param_2_local;
  handle s;
  
  buffer_00 = (char *)std::__cxx11::string::c_str();
  nbytes_00 = std::__cxx11::string::size();
  param_2_local = decode_utfN(buffer_00,nbytes_00);
  bVar1 = handle::operator_cast_to_bool(&param_2_local);
  if (!bVar1) {
    this = (error_already_set *)__cxa_allocate_exception(0x28);
    error_already_set::error_already_set(this);
    __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  return (handle)param_2_local.m_ptr;
}

Assistant:

static handle cast(const StringType &src, return_value_policy /* policy */, handle /* parent */) {
        const char *buffer = reinterpret_cast<const char *>(src.c_str());
        ssize_t nbytes = ssize_t(src.size() * sizeof(CharT));
        handle s = decode_utfN(buffer, nbytes);
        if (!s) throw error_already_set();
        return s;
    }